

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O1

void __thiscall
testing::internal::
BoundSecondMatcher<testing::internal::Eq2Matcher,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::
Impl<const_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
::Impl(Impl<const_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
       *this,Eq2Matcher *tm,
      pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      *second)

{
  pointer pcVar1;
  undefined8 *puVar2;
  undefined4 *puVar3;
  
  (this->
  super_MatcherInterface<const_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
  ).super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__Impl_0190e0e0;
  puVar2 = (undefined8 *)operator_new(8);
  *puVar2 = &PTR__MatcherDescriberInterface_0190e1f0;
  (this->mono_tuple2_matcher_).
  super_MatcherBase<const_std::tuple<const_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  .super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_0190e1a0;
  (this->mono_tuple2_matcher_).
  super_MatcherBase<const_std::tuple<const_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  .vtable_ = (VTable *)0x0;
  (this->mono_tuple2_matcher_).
  super_MatcherBase<const_std::tuple<const_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  .buffer_.ptr = (void *)0x0;
  (this->mono_tuple2_matcher_).
  super_MatcherBase<const_std::tuple<const_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  .vtable_ = (VTable *)
             MatcherBase<std::tuple<std::pair<int_const,std::__cxx11::string>const&,std::pair<int_const,std::__cxx11::string>>const&>
             ::
             GetVTable<testing::internal::MatcherBase<std::tuple<std::pair<int_const,std::__cxx11::string>const&,std::pair<int_const,std::__cxx11::string>>const&>::ValuePolicy<testing::MatcherInterface<std::tuple<std::pair<int_const,std::__cxx11::string>const&,std::pair<int_const,std::__cxx11::string>>const&>const*,true>>()
             ::kVTable_abi_cxx11_;
  puVar3 = (undefined4 *)operator_new(0x10);
  *puVar3 = 1;
  *(undefined8 **)(puVar3 + 2) = puVar2;
  (this->mono_tuple2_matcher_).
  super_MatcherBase<const_std::tuple<const_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  .buffer_.ptr = puVar3;
  (this->mono_tuple2_matcher_).
  super_MatcherBase<const_std::tuple<const_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  .super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_0190e130;
  (this->second_value_).first = second->first;
  (this->second_value_).second._M_dataplus._M_p = (pointer)&(this->second_value_).second.field_2;
  pcVar1 = (second->second)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->second_value_).second,pcVar1,
             pcVar1 + (second->second)._M_string_length);
  return;
}

Assistant:

Impl(const Tuple2Matcher& tm, const Second& second)
        : mono_tuple2_matcher_(SafeMatcherCast<const ArgTuple&>(tm)),
          second_value_(second) {}